

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O3

void CBlockFileInfo::SerializationOps<DataStream,CBlockFileInfo,ActionUnserialize>
               (uint *obj,DataStream *s)

{
  long lVar1;
  uint uVar2;
  unsigned_long uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  *obj = uVar2;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  obj[1] = uVar2;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  obj[2] = uVar2;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  obj[3] = uVar2;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  obj[4] = uVar2;
  uVar3 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_long>(s);
  *(unsigned_long *)(obj + 6) = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar3 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_long>(s);
    *(unsigned_long *)(obj + 8) = uVar3;
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CBlockFileInfo, obj)
    {
        READWRITE(VARINT(obj.nBlocks));
        READWRITE(VARINT(obj.nSize));
        READWRITE(VARINT(obj.nUndoSize));
        READWRITE(VARINT(obj.nHeightFirst));
        READWRITE(VARINT(obj.nHeightLast));
        READWRITE(VARINT(obj.nTimeFirst));
        READWRITE(VARINT(obj.nTimeLast));
    }